

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *positionalMode,bool *spacePadPositive,int *ntrunc,
                 char *fmtStart,FormatArg *args,int *argIndex,int numArgs)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  format_error *pfVar6;
  uint uVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  allocator<char> local_61;
  char *c;
  int precision;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*fmtStart != '%') {
    __assert_fail("*fmtStart == \'%\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/tinyformat.h"
                  ,0x29a,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  pp_Var5 = out->_vptr_basic_ostream;
  *(undefined8 *)(&out->field_0x10 + (long)pp_Var5[-3]) = 0;
  *(undefined8 *)(&out->field_0x8 + (long)pp_Var5[-3]) = 6;
  p_Var4 = pp_Var5[-3];
  std::ios::fill();
  (&out->field_0xe0)[(long)p_Var4] = 0x20;
  *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
       *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffb000;
  c = fmtStart + 1;
  cVar1 = fmtStart[1];
  if ((byte)(cVar1 - 0x30U) < 10) {
    iVar3 = parseIntAndAdvance(&c);
    if (*c == '$') {
      if ((0 < iVar3) && (iVar3 <= numArgs)) {
        *argIndex = iVar3 + -1;
        c = c + 1;
        *positionalMode = true;
        goto LAB_002066c7;
      }
      pfVar6 = (format_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precision,"tinyformat: Positional argument out of range",&local_61);
      format_error::format_error(pfVar6,(string *)&precision);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pfVar6,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (*positionalMode != true) {
        if (cVar1 == '0') {
          p_Var4 = out->_vptr_basic_ostream[-3];
          std::ios::fill();
          (&out->field_0xe0)[(long)p_Var4] = 0x30;
          *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
               *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x10;
        }
        if (iVar3 != 0) {
          *(long *)(&out->field_0x10 + (long)out->_vptr_basic_ostream[-3]) = (long)iVar3;
          bVar2 = true;
          lVar8 = 0;
          goto LAB_00206834;
        }
LAB_002066c7:
        lVar8 = 0;
        do {
          cVar1 = *c;
          if (cVar1 == ' ') {
            if (((&out->field_0x19)[(long)out->_vptr_basic_ostream[-3]] & 8) == 0) {
              *spacePadPositive = true;
            }
          }
          else if (cVar1 == '0') {
            p_Var4 = out->_vptr_basic_ostream[-3];
            if (((&out->field_0x18)[(long)p_Var4] & 0x20) == 0) {
              std::ios::fill();
              (&out->field_0xe0)[(long)p_Var4] = 0x30;
              p_Var4 = out->_vptr_basic_ostream[-3];
              uVar7 = *(uint *)(&out->field_0x18 + (long)p_Var4) & 0xffffff4f | 0x10;
LAB_0020676c:
              *(uint *)(&out->field_0x18 + (long)p_Var4) = uVar7;
            }
          }
          else if (cVar1 == '+') {
            *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
                 *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x800;
            *spacePadPositive = false;
            lVar8 = 1;
          }
          else {
            if (cVar1 == '-') {
              p_Var4 = out->_vptr_basic_ostream[-3];
              std::ios::fill();
              (&out->field_0xe0)[(long)p_Var4] = 0x20;
              p_Var4 = out->_vptr_basic_ostream[-3];
              uVar7 = *(uint *)(&out->field_0x18 + (long)p_Var4) & 0xffffff4f | 0x20;
              goto LAB_0020676c;
            }
            if (cVar1 != '#') goto LAB_002067ae;
            *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
                 *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) | 0x600;
          }
          c = c + 1;
        } while( true );
      }
      pfVar6 = (format_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precision,
                 "tinyformat: Non-positional argument used after a positional one",&local_61);
      format_error::format_error(pfVar6,(string *)&precision);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pfVar6,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    if (*positionalMode != true) goto LAB_002066c7;
    pfVar6 = (format_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&precision,
               "tinyformat: Non-positional argument used after a positional one",&local_61);
    format_error::format_error(pfVar6,(string *)&precision);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pfVar6,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  goto LAB_00206d48;
LAB_002067ae:
  precision = 0;
  bVar2 = parseWidthOrPrecision(&precision,&c,*positionalMode,args,argIndex,numArgs);
  if (bVar2) {
    pp_Var5 = out->_vptr_basic_ostream;
    iVar3 = precision;
    if (precision < 0) {
      p_Var4 = pp_Var5[-3];
      std::ios::fill();
      (&out->field_0xe0)[(long)p_Var4] = 0x20;
      pp_Var5 = out->_vptr_basic_ostream;
      *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
           *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) & 0xffffff4f | 0x20;
      iVar3 = -precision;
    }
    *(long *)(&out->field_0x10 + (long)pp_Var5[-3]) = (long)iVar3;
  }
LAB_00206834:
  if (*c == '.') {
    c = c + 1;
    precision = 0;
    parseWidthOrPrecision(&precision,&c,*positionalMode,args,argIndex,numArgs);
    bVar9 = -1 < (long)precision;
    if (bVar9) {
      *(long *)(&out->field_0x8 + (long)out->_vptr_basic_ostream[-3]) = (long)precision;
    }
  }
  else {
    bVar9 = false;
  }
LAB_0020689e:
  cVar1 = *c;
  switch(cVar1) {
  case 'E':
    pp_Var5 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) | 0x4000;
LAB_00206a0c:
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) & 0xfffffefb | 0x100;
    p_Var4 = pp_Var5[-3];
    uVar7 = *(uint *)(&out->field_0x18 + (long)p_Var4) & 0xffffffb5 | 2;
LAB_00206a89:
    *(uint *)(&out->field_0x18 + (long)p_Var4) = uVar7;
    goto switchD_002068b4_caseD_48;
  case 'F':
    pp_Var5 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) | 0x4000;
    goto LAB_00206a79;
  case 'G':
    pp_Var5 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) | 0x4000;
    goto LAB_00206a42;
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'b':
  case 'c':
  case 'k':
  case 'm':
  case 'q':
  case 'r':
  case 'v':
  case 'w':
  case 'y':
    goto switchD_002068b4_caseD_48;
  case 'L':
  case 'h':
  case 'j':
  case 'l':
  case 't':
  case 'z':
    goto switchD_002068b4_caseD_4c;
  case 'X':
    pp_Var5 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) | 0x4000;
    goto LAB_002069d2;
  case 'a':
    pp_Var5 = out->_vptr_basic_ostream;
    goto LAB_00206b08;
  case 'd':
  case 'i':
  case 'u':
    pp_Var5 = out->_vptr_basic_ostream;
    uVar7 = 2;
    break;
  case 'e':
    pp_Var5 = out->_vptr_basic_ostream;
    goto LAB_00206a0c;
  case 'f':
    pp_Var5 = out->_vptr_basic_ostream;
LAB_00206a79:
    p_Var4 = pp_Var5[-3];
    uVar7 = *(uint *)(&out->field_0x18 + (long)p_Var4) & 0xfffffefb | 4;
    goto LAB_00206a89;
  case 'g':
    pp_Var5 = out->_vptr_basic_ostream;
LAB_00206a42:
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) & 0xffffffb5 | 2;
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) & 0xfffffefb;
    goto switchD_002068b4_caseD_48;
  case 'n':
    pfVar6 = (format_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&precision,"tinyformat: %n conversion spec not supported",&local_61);
    format_error::format_error(pfVar6,(string *)&precision);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pfVar6,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00206d48;
  case 'o':
    pp_Var5 = out->_vptr_basic_ostream;
    uVar7 = 0x40;
    break;
  case 'p':
  case 'x':
    pp_Var5 = out->_vptr_basic_ostream;
LAB_002069d2:
    uVar7 = 8;
    break;
  case 's':
    pp_Var5 = out->_vptr_basic_ostream;
    if (bVar9) {
      *ntrunc = *(int *)(&out->field_0x8 + (long)pp_Var5[-3]);
    }
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) | 1;
    goto switchD_002068b4_caseD_48;
  default:
    if (cVar1 != 'A') {
      if (cVar1 != '\0') goto switchD_002068b4_caseD_48;
      pfVar6 = (format_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precision,
                 "tinyformat: Conversion spec incorrectly terminated by end of string",&local_61);
      format_error::format_error(pfVar6,(string *)&precision);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pfVar6,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00206d48;
    }
    pp_Var5 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) | 0x4000;
LAB_00206b08:
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) | 0x104;
    goto switchD_002068b4_caseD_48;
  }
  *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
       *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) & 0xffffffb5 | uVar7;
  if (bVar2 == false && bVar9) {
    *(long *)(&out->field_0x10 + (long)pp_Var5[-3]) =
         lVar8 + *(long *)(&out->field_0x8 + (long)pp_Var5[-3]);
    *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var5[-3]) & 0xffffff4f | 0x10;
    p_Var4 = pp_Var5[-3];
    std::ios::fill();
    (&out->field_0xe0)[(long)p_Var4] = 0x30;
  }
  goto switchD_002068b4_caseD_48;
switchD_002068b4_caseD_4c:
  c = c + 1;
  goto LAB_0020689e;
switchD_002068b4_caseD_48:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return c + 1;
  }
LAB_00206d48:
  __stack_chk_fail();
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& positionalMode,
                                         bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* args,
                                         int& argIndex, int numArgs)
{
    TINYFORMAT_ASSERT(*fmtStart == '%');
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;

    // 1) Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag.
    if (*c >= '0' && *c <= '9') {
        const char tmpc = *c;
        int value = parseIntAndAdvance(c);
        if (*c == '$') {
            // value is an argument index
            if (value > 0 && value <= numArgs)
                argIndex = value - 1;
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
            positionalMode = true;
        }
        else if (positionalMode) {
            TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
        }
        else {
            if (tmpc == '0') {
                // Use internal padding so that numeric values are
                // formatted correctly, eg -00010 rather than 000-10
                out.fill('0');
                out.setf(std::ios::internal, std::ios::adjustfield);
            }
            if (value != 0) {
                // Nonzero value means that we parsed width.
                widthSet = true;
                out.width(value);
            }
        }
    }
    else if (positionalMode) {
        TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
    }
    // 2) Parse flags and width if we did not do it in previous step.
    if (!widthSet) {
        // Parse flags
        for (;; ++c) {
            switch (*c) {
                case '#':
                    out.setf(std::ios::showpoint | std::ios::showbase);
                    continue;
                case '0':
                    // overridden by left alignment ('-' flag)
                    if (!(out.flags() & std::ios::left)) {
                        // Use internal padding so that numeric values are
                        // formatted correctly, eg -00010 rather than 000-10
                        out.fill('0');
                        out.setf(std::ios::internal, std::ios::adjustfield);
                    }
                    continue;
                case '-':
                    out.fill(' ');
                    out.setf(std::ios::left, std::ios::adjustfield);
                    continue;
                case ' ':
                    // overridden by show positive sign, '+' flag.
                    if (!(out.flags() & std::ios::showpos))
                        spacePadPositive = true;
                    continue;
                case '+':
                    out.setf(std::ios::showpos);
                    spacePadPositive = false;
                    widthExtra = 1;
                    continue;
                default:
                    break;
            }
            break;
        }
        // Parse width
        int width = 0;
        widthSet = parseWidthOrPrecision(width, c, positionalMode,
                                         args, argIndex, numArgs);
        if (widthSet) {
            if (width < 0) {
                // negative widths correspond to '-' flag set
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                width = -width;
            }
            out.width(width);
        }
    }
    // 3) Parse precision
    if (*c == '.') {
        ++c;
        int precision = 0;
        parseWidthOrPrecision(precision, c, positionalMode,
                              args, argIndex, numArgs);
        // Presence of `.` indicates precision set, unless the inferred value
        // was negative in which case the default is used.
        precisionSet = precision >= 0;
        if (precisionSet)
            out.precision(precision);
    }
    // 4) Ignore any C99 length modifier
    while (*c == 'l' || *c == 'h' || *c == 'L' ||
           *c == 'j' || *c == 'z' || *c == 't') {
        ++c;
    }
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch (*c) {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'A':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'a':
#           ifdef _MSC_VER
            // Workaround https://developercommunity.visualstudio.com/content/problem/520472/hexfloat-stream-output-does-not-ignore-precision-a.html
            // by always setting maximum precision on MSVC to avoid precision
            // loss for doubles.
            out.precision(13);
#           endif
            out.setf(std::ios::fixed | std::ios::scientific, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if (precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print Booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if (intConversion && precisionSet && !widthSet) {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}